

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint *puVar1;
  uv__io_t **ppuVar2;
  int iVar3;
  uint uVar4;
  char *__assertion;
  
  if ((uint)pevents < 0x10) {
    if ((handle->flags & 3) == 0) {
      ppuVar2 = handle->loop->watchers;
      iVar3 = uv__fd_exists(handle->loop,(handle->io_watcher).fd);
      if ((iVar3 == 0) || (ppuVar2[(handle->io_watcher).fd] == &handle->io_watcher)) {
        uv__poll_stop(handle);
        iVar3 = 0;
        if (pevents != 0) {
          uVar4 = (pevents & 1U) + 2;
          if ((uint)pevents < 8) {
            uVar4 = pevents & 1U;
          }
          uv__io_start(handle->loop,&handle->io_watcher,
                       (pevents & 4U) * 0x800 + (pevents & 2U) * 2 | uVar4);
          uVar4 = handle->flags;
          if (((uVar4 & 4) == 0) && (handle->flags = uVar4 | 4, (uVar4 & 8) != 0)) {
            puVar1 = &handle->loop->active_handles;
            *puVar1 = *puVar1 + 1;
          }
          handle->poll_cb = poll_cb;
          iVar3 = 0;
        }
      }
      else {
        iVar3 = -0x11;
      }
      return iVar3;
    }
    __assertion = "!uv__is_closing(handle)";
    uVar4 = 0x7e;
  }
  else {
    __assertion = "(pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT | UV_PRIORITIZED)) == 0";
    uVar4 = 0x7d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/poll.c"
                ,uVar4,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  uv__io_t** watchers;
  uv__io_t* w;
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT |
                      UV_PRIORITIZED)) == 0);
  assert(!uv__is_closing(handle));

  watchers = handle->loop->watchers;
  w = &handle->io_watcher;

  if (uv__fd_exists(handle->loop, w->fd))
    if (watchers[w->fd] != w)
      return UV_EEXIST;

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= POLLIN;
  if (pevents & UV_PRIORITIZED)
    events |= UV__POLLPRI;
  if (pevents & UV_WRITABLE)
    events |= POLLOUT;
  if (pevents & UV_DISCONNECT)
    events |= UV__POLLRDHUP;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}